

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arcfour.c
# Opt level: O3

void arcfour_ssh2_setkey(ssh_cipher *cipher,void *key)

{
  char cVar1;
  uint uVar2;
  long lVar3;
  void *__s;
  byte bVar4;
  ulong uVar5;
  char local_118 [264];
  
  uVar2 = cipher->vt->padded_keybytes;
  if (uVar2 < 0x101) {
    *(undefined2 *)&cipher[-0x21].vt = 0;
    uVar5 = 0;
    do {
      *(char *)((long)cipher + (uVar5 - 0x106)) = (char)uVar5;
      local_118[uVar5] = *(char *)((long)key + (uVar5 & 0xffffffff) % (ulong)uVar2);
      uVar5 = uVar5 + 1;
    } while (uVar5 != 0x100);
    lVar3 = 0;
    bVar4 = 0;
    do {
      cVar1 = *(char *)((long)cipher + lVar3 + -0x106);
      bVar4 = bVar4 + cVar1 + local_118[lVar3];
      *(undefined1 *)((long)cipher + lVar3 + -0x106) =
           *(undefined1 *)((long)cipher + ((ulong)bVar4 - 0x106));
      *(char *)((long)cipher + ((ulong)bVar4 - 0x106)) = cVar1;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x100);
    __s = safemalloc(0x600,1,0);
    memset(__s,0,0x600);
    arcfour_block(cipher + -0x21,__s,0x600);
    smemclr(__s,0x600);
    safefree(__s);
    return;
  }
  __assert_fail("keybytes <= 256",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/arcfour.c"
                ,0x28,"void arcfour_setkey(ArcfourContext *, const unsigned char *, unsigned int)");
}

Assistant:

static void arcfour_ssh2_setkey(ssh_cipher *cipher, const void *key)
{
    ArcfourContext *ctx = container_of(cipher, ArcfourContext, ciph);
    arcfour_setkey(ctx, key, ctx->ciph.vt->padded_keybytes);
    arcfour_stir(ctx);
}